

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

vec4 dja::lerp(float_t u,vec4 *a,vec4 *b)

{
  vec4 vVar1;
  vec4 local_18;
  
  vVar1 = operator-(b,a);
  local_18.x = vVar1.x * u;
  local_18.y = vVar1.y * u;
  local_18.z = u * vVar1.z;
  local_18.w = u * vVar1.w;
  vVar1 = operator+(a,&local_18);
  return vVar1;
}

Assistant:

V4 lerp(const V1 u, const V4& a, const V4& b) {return a + u * (b - a);}